

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

void __thiscall
FCompressedFile::FCompressedFile
          (FCompressedFile *this,FILE *file,EOpenMode mode,bool dontCompress,bool postopen)

{
  uint *puVar1;
  uint uVar2;
  uchar *puVar3;
  undefined3 in_register_00000081;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  uint uStack_28;
  uint uStack_24;
  
  (this->super_FFile)._vptr_FFile = (_func_int **)&PTR__FCompressedFile_007c90e8;
  this->m_Pos = 0;
  this->m_BufferSize = 0;
  this->m_MaxBufferSize = 0;
  this->m_Buffer = (uchar *)0x0;
  this->m_Mode = mode;
  this->m_File = file;
  this->m_NoCompress = dontCompress;
  if (CONCAT31(in_register_00000081,postopen) != 0) {
    if (((FILE *)this->m_File != (FILE *)0x0) && (this->m_Mode == EReading)) {
      fread(&cStack_2c,4,1,(FILE *)this->m_File);
      if ((cStack_2a != 'Z' || (cStack_2b != 'L' || cStack_2c != 'F')) || cStack_29 != 'L') {
        fclose((FILE *)this->m_File);
        this->m_File = (FILE *)0x0;
        if ((cStack_2a == 'Z' && (cStack_2b == 'L' && cStack_2c == 'F')) && cStack_29 == 'O') {
          Printf("Compressed files from older ZDooms are not supported.\n");
        }
      }
      else {
        fread(&uStack_28,4,2,(FILE *)this->m_File);
        uVar2 = uStack_24 >> 0x18 | (uStack_24 & 0xff0000) >> 8 | (uStack_24 & 0xff00) << 8 |
                uStack_24 << 0x18;
        if (uStack_28 != 0) {
          uVar2 = uStack_28 >> 0x18 | (uStack_28 & 0xff0000) >> 8 | (uStack_28 & 0xff00) << 8 |
                  uStack_28 << 0x18;
        }
        puVar3 = (uchar *)M_Malloc_Dbg((ulong)(uVar2 + 8),
                                       "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/farchive.cpp"
                                       ,0xd5);
        this->m_Buffer = puVar3;
        fread(puVar3 + 8,(ulong)uVar2,1,(FILE *)this->m_File);
        puVar1 = (uint *)this->m_Buffer;
        *puVar1 = uStack_28;
        puVar1[1] = uStack_24;
        Explode(this);
      }
    }
    return;
  }
  return;
}

Assistant:

FCompressedFile::FCompressedFile (FILE *file, EOpenMode mode, bool dontCompress, bool postopen)
{
	BeEmpty ();
	m_Mode = mode;
	m_File = file;
	m_NoCompress = dontCompress;
	if (postopen)
	{
		PostOpen ();
	}
}